

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmFuncts.cpp
# Opt level: O0

string * AsmFuncts::getFuncCode(string *__return_storage_ptr__,string *op)

{
  __type_conflict _Var1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  allocator local_1d;
  int local_1c;
  string *psStack_18;
  int i;
  string *op_local;
  
  local_1c = 0;
  psStack_18 = op;
  op_local = __return_storage_ptr__;
  while( true ) {
    uVar2 = (ulong)local_1c;
    sVar3 = std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size(&Codes::typeROp_abi_cxx11_);
    if (sVar3 <= uVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"000000",&local_1d);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d);
      return __return_storage_ptr__;
    }
    pvVar4 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&Codes::typeROp_abi_cxx11_,(long)local_1c);
    _Var1 = std::operator==(op,&pvVar4->second);
    if (_Var1) break;
    pvVar4 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&Codes::typeROp_abi_cxx11_,(long)local_1c);
    _Var1 = std::operator==(op,&pvVar4->first);
    if (_Var1) {
      pvVar4 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&Codes::typeROp_abi_cxx11_,(long)local_1c);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pvVar4->second);
      return __return_storage_ptr__;
    }
    local_1c = local_1c + 1;
  }
  pvVar4 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&Codes::typeROp_abi_cxx11_,(long)local_1c);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar4);
  return __return_storage_ptr__;
}

Assistant:

string AsmFuncts::getFuncCode(string op) {
    for (int i = 0; i < Codes::typeROp.size(); i++) {
        if(op == Codes::typeROp[i].second)
            return Codes::typeROp[i].first;
        if(op == Codes::typeROp[i].first)
            return Codes::typeROp[i].second;
    }
    return "000000";
}